

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

int GetHistoBinIndex(VP8LHistogram *h,DominantCostRange *c,int low_effort)

{
  int iVar1;
  int iVar2;
  int in_EDX;
  double *in_RSI;
  long in_RDI;
  int bin_id;
  int local_18;
  
  local_18 = GetBinIdForEntropy(in_RSI[1],*in_RSI,*(double *)(in_RDI + 0xcb8));
  if (in_EDX == 0) {
    iVar1 = GetBinIdForEntropy(in_RSI[3],in_RSI[2],*(double *)(in_RDI + 0xcc0));
    iVar2 = GetBinIdForEntropy(in_RSI[5],in_RSI[4],*(double *)(in_RDI + 0xcc8));
    local_18 = (local_18 * 4 + iVar1) * 4 + iVar2;
  }
  return local_18;
}

Assistant:

static int GetHistoBinIndex(const VP8LHistogram* const h,
                            const DominantCostRange* const c, int low_effort) {
  int bin_id = GetBinIdForEntropy(c->literal_min_, c->literal_max_,
                                  h->literal_cost_);
  assert(bin_id < NUM_PARTITIONS);
  if (!low_effort) {
    bin_id = bin_id * NUM_PARTITIONS
           + GetBinIdForEntropy(c->red_min_, c->red_max_, h->red_cost_);
    bin_id = bin_id * NUM_PARTITIONS
           + GetBinIdForEntropy(c->blue_min_, c->blue_max_, h->blue_cost_);
    assert(bin_id < BIN_SIZE);
  }
  return bin_id;
}